

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteField(WatWriter *this,Field *field)

{
  if (field->mutable_ == true) {
    WriteOpenSpace(this,"mut");
  }
  WriteType(this,(Type)(field->type).enum_,Space);
  if (field->mutable_ == true) {
    WriteCloseSpace(this);
    return;
  }
  return;
}

Assistant:

void WatWriter::WriteField(const Field& field) {
  if (field.mutable_) {
    WriteOpenSpace("mut");
  }
  WriteType(field.type, NextChar::Space);
  if (field.mutable_) {
    WriteCloseSpace();
  }
}